

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmGeneratorTarget *target)

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_40;
  size_type local_28;
  pointer local_20;
  undefined8 local_18;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_40.first._M_len = 0xb;
  local_40.first._M_str = "CMakeFiles/";
  local_40.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20 = (psVar1->_M_dataplus)._M_p;
  local_28 = psVar1->_M_string_length;
  local_18 = 0;
  views._M_len = 2;
  views._M_array = &local_40;
  cmCatViews(__return_storage_ptr__,views);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat("CMakeFiles/", target->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}